

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_ed25519_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,EVP_PKEY **out_ctx)

{
  int iVar1;
  void *__dest;
  uchar *comment;
  uchar *p;
  size_t tmp_len;
  size_t key_len;
  uchar *buf;
  uchar *priv_key;
  uchar *pub_key;
  int ret;
  int i;
  uchar *key;
  uchar *method_buf;
  EVP_PKEY *ctx;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  string_buf *decrypted_local;
  LIBSSH2_SESSION *session_local;
  
  method_buf = (uchar *)0x0;
  key = (uchar *)0x0;
  _ret = (uchar *)0x0;
  pub_key._0_4_ = 0;
  tmp_len = 0;
  p = (uchar *)0x0;
  ctx = (EVP_PKEY *)pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = &decrypted->data;
  decrypted_local = (string_buf *)session;
  iVar1 = _libssh2_get_string(decrypted,&priv_key,(size_t *)&p);
  if ((iVar1 == 0) && (p == (uchar *)0x20)) {
    iVar1 = _libssh2_get_string((string_buf *)method_local,&buf,(size_t *)&p);
    if ((iVar1 == 0) && (p == (uchar *)0x40)) {
      method_buf = (uchar *)EVP_PKEY_new_raw_private_key(0x43f,0,buf,0x20);
      iVar1 = _libssh2_get_string((string_buf *)method_local,(uchar **)&key_len,(size_t *)&p);
      if (iVar1 == 0) {
        if ((p != (uchar *)0x0) &&
           (__dest = _libssh2_calloc((LIBSSH2_SESSION *)decrypted_local,(size_t)(p + 1)),
           __dest != (void *)0x0)) {
          memcpy(__dest,(void *)key_len,(size_t)p);
          *(uchar *)((long)__dest + (long)p) = '\0';
          (*(code *)decrypted_local[1].data)(__dest,decrypted_local);
        }
        pub_key._4_4_ = 1;
        while (method_local[1] < *method_local + (long)method_local[2]) {
          if (*method_local[1] != pub_key._4_4_) {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"Wrong padding");
            pub_key._0_4_ = -1;
            goto LAB_00112fca;
          }
          pub_key._4_4_ = pub_key._4_4_ + 1;
          method_local[1] = method_local[1] + 1;
        }
        if ((int)pub_key == 0) {
          key = (uchar *)(*(code *)decrypted_local->dataptr)(0xb,decrypted_local);
          if (key == (uchar *)0x0) {
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-6,
                           "Unable to allocate memory for ED25519 key");
          }
          else {
            tmp_len = 0x33;
            comment = (uchar *)_libssh2_calloc((LIBSSH2_SESSION *)decrypted_local,0x33);
            _ret = comment;
            if (comment != (uchar *)0x0) {
              _libssh2_store_str(&comment,"ssh-ed25519",0xb);
              _libssh2_store_str(&comment,(char *)priv_key,0x20);
              builtin_memcpy(key,"ssh-ed25519",0xb);
              if (method_len_local == (size_t *)0x0) {
                (*(code *)decrypted_local[1].data)(key,decrypted_local);
              }
              else {
                *method_len_local = (size_t)key;
              }
              if (pubkeydata_local != (uchar **)0x0) {
                *pubkeydata_local = (uchar *)0xb;
              }
              if (pubkeydata_len_local == (size_t *)0x0) {
                (*(code *)decrypted_local[1].data)(_ret,decrypted_local);
              }
              else {
                *pubkeydata_len_local = (size_t)_ret;
              }
              if (ctx != (EVP_PKEY *)0x0) {
                *(size_t *)ctx = tmp_len;
              }
              if (out_ctx == (EVP_PKEY **)0x0) {
                if (method_buf != (uchar *)0x0) {
                  EVP_PKEY_free((EVP_PKEY *)method_buf);
                }
              }
              else {
                *out_ctx = (EVP_PKEY *)method_buf;
              }
              return 0;
            }
            _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-6,
                           "Unable to allocate memory for ED25519 key");
          }
        }
      }
      else {
        _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"Unable to read comment");
        pub_key._0_4_ = -1;
      }
    }
    else {
      _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"Wrong private key length");
      pub_key._0_4_ = -1;
    }
LAB_00112fca:
    if (method_buf != (uchar *)0x0) {
      EVP_PKEY_free((EVP_PKEY *)method_buf);
    }
    if (key != (uchar *)0x0) {
      (*(code *)decrypted_local[1].data)(key,decrypted_local);
    }
    if (_ret != (uchar *)0x0) {
      (*(code *)decrypted_local[1].data)(_ret,decrypted_local);
    }
  }
  else {
    _libssh2_error((LIBSSH2_SESSION *)decrypted_local,-0xe,"Wrong public key length");
  }
  return -1;
}

Assistant:

static int
gen_publickey_from_ed25519_openssh_priv_data(LIBSSH2_SESSION *session,
                                             struct string_buf *decrypted,
                                             unsigned char **method,
                                             size_t *method_len,
                                             unsigned char **pubkeydata,
                                             size_t *pubkeydata_len,
                                             libssh2_ed25519_ctx **out_ctx)
{
    libssh2_ed25519_ctx *ctx = NULL;
    unsigned char *method_buf = NULL;
    unsigned char *key = NULL;
    int i, ret = 0;
    unsigned char *pub_key, *priv_key, *buf;
    size_t key_len = 0, tmp_len = 0;
    unsigned char *p;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing ED25519 keys from private key data"));

    if(_libssh2_get_string(decrypted, &pub_key, &tmp_len) ||
       tmp_len != LIBSSH2_ED25519_KEY_LEN) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Wrong public key length");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &priv_key, &tmp_len) ||
       tmp_len != LIBSSH2_ED25519_PRIVATE_KEY_LEN) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Wrong private key length");
        ret = -1;
        goto clean_exit;
    }

    /* first 32 bytes of priv_key is the private key, the last 32 bytes are
       the public key */
    ctx = EVP_PKEY_new_raw_private_key(EVP_PKEY_ED25519, NULL,
                                       (const unsigned char *)priv_key,
                                       LIBSSH2_ED25519_KEY_LEN);

    /* comment */
    if(_libssh2_get_string(decrypted, &buf, &tmp_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Unable to read comment");
        ret = -1;
        goto clean_exit;
    }

    if(tmp_len > 0) {
        unsigned char *comment = LIBSSH2_CALLOC(session, tmp_len + 1);
        if(comment) {
            memcpy(comment, buf, tmp_len);
            memcpy(comment + tmp_len, "\0", 1);

            _libssh2_debug((session, LIBSSH2_TRACE_AUTH, "Key comment: %s",
                           comment));

            LIBSSH2_FREE(session, comment);
        }
    }

    /* Padding */
    i = 1;
    while(decrypted->dataptr < decrypted->data + decrypted->len) {
        if(*decrypted->dataptr != i) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "Wrong padding");
            ret = -1;
            goto clean_exit;
        }
        i++;
        decrypted->dataptr++;
    }

    if(ret == 0) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Computing public key from ED25519 "
                       "private key envelope"));

        method_buf = LIBSSH2_ALLOC(session, 11);  /* ssh-ed25519. */
        if(!method_buf) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        /* Key form is: type_len(4) + type(11) + pub_key_len(4) +
           pub_key(32). */
        key_len = LIBSSH2_ED25519_KEY_LEN + 19;
        key = LIBSSH2_CALLOC(session, key_len);
        if(!key) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        p = key;

        _libssh2_store_str(&p, "ssh-ed25519", 11);
        _libssh2_store_str(&p, (const char *)pub_key, LIBSSH2_ED25519_KEY_LEN);

        memcpy(method_buf, "ssh-ed25519", 11);

        if(method)
            *method = method_buf;
        else
            LIBSSH2_FREE(session, method_buf);

        if(method_len)
            *method_len = 11;

        if(pubkeydata)
            *pubkeydata = key;
        else
            LIBSSH2_FREE(session, key);

        if(pubkeydata_len)
            *pubkeydata_len = key_len;

        if(out_ctx)
            *out_ctx = ctx;
        else if(ctx)
            _libssh2_ed25519_free(ctx);

        return 0;
    }

clean_exit:

    if(ctx)
        _libssh2_ed25519_free(ctx);

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    if(key)
        LIBSSH2_FREE(session, key);

    return -1;
}